

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

void __thiscall SQArray::Mark(SQArray *this,SQCollectable **chain)

{
  ulong uVar1;
  SQUnsignedInteger SVar2;
  SQUnsignedInteger SVar3;
  bool bVar4;
  
  uVar1 = (this->super_SQCollectable).super_SQRefCounted._uiRef;
  if (-1 < (int)uVar1) {
    (this->super_SQCollectable).super_SQRefCounted._uiRef = uVar1 | 0x80000000;
    SVar3 = (this->_values)._size;
    SVar2 = 0;
    if ((long)SVar3 < 1) {
      SVar3 = SVar2;
    }
    while (bVar4 = SVar3 != 0, SVar3 = SVar3 - 1, bVar4) {
      SQSharedState::MarkObject
                ((SQObjectPtr *)((long)&(((this->_values)._vals)->super_SQObject)._type + SVar2),
                 (SQCollectable_conflict **)chain);
      SVar2 = SVar2 + 0x10;
    }
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
    return;
  }
  return;
}

Assistant:

void SQArray::Mark(SQCollectable **chain)
{
    START_MARK()
        SQInteger len = _values.size();
        for(SQInteger i = 0;i < len; i++) SQSharedState::MarkObject(_values[i], chain);
    END_MARK()
}